

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Experiment.cpp
# Opt level: O2

void __thiscall celero::Experiment::Experiment(Experiment *this)

{
  Pimpl<celero::Experiment::Impl>::Pimpl(&this->pimpl);
  return;
}

Assistant:

Experiment::Experiment() : pimpl()
{
}